

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_decrypt_buf(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  uchar *output;
  size_t sVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  undefined8 in_stack_fffffffffffffe60;
  undefined4 uVar9;
  size_t extra_run;
  size_t j;
  uchar tmp [48];
  size_t padding_idx;
  size_t real_count;
  size_t pad_count;
  uchar pseudo_hdr [13];
  uchar computed_mac [48];
  size_t olen_2;
  size_t minlen;
  size_t dec_msglen_1;
  uchar *dec_msg_result_1;
  uchar *dec_msg_1;
  int ret_2;
  size_t explicit_iv_len;
  uchar taglen;
  uchar add_data [13];
  uchar *dec_msg_result;
  uchar *dec_msg;
  size_t olen_1;
  size_t dec_msglen;
  size_t sStack_58;
  int ret_1;
  size_t olen;
  ulong uStack_48;
  int ret;
  size_t correct;
  size_t padlen;
  int auth_done;
  mbedtls_cipher_mode_t mode;
  size_t i;
  mbedtls_ssl_context *ssl_local;
  
  uVar9 = (undefined4)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  padlen._0_4_ = 0;
  correct = 0;
  uStack_48 = 1;
  i = (size_t)ssl;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x622,"=> decrypt buf");
  if ((*(long *)(i + 0x40) == 0) || (*(long *)(i + 0x68) == 0)) {
    mbedtls_debug_print_msg
              ((mbedtls_ssl_context *)i,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x626,"should never happen");
    ssl_local._4_4_ = -0x6c00;
  }
  else {
    padlen._4_4_ = mbedtls_cipher_get_cipher_mode
                             ((mbedtls_cipher_context_t *)(*(long *)(i + 0x68) + 0x100));
    if (*(ulong *)(i + 0xe0) < *(ulong *)(*(long *)(i + 0x68) + 0x10)) {
      mbedtls_debug_print_msg
                ((mbedtls_ssl_context *)i,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0x62f,"in_msglen (%d) < minlen (%d)",*(undefined8 *)(i + 0xe0),
                 *(undefined8 *)(*(long *)(i + 0x68) + 0x10));
      ssl_local._4_4_ = -0x7180;
    }
    else {
      if (padlen._4_4_ == MBEDTLS_MODE_STREAM) {
        sStack_58 = 0;
        correct = 0;
        olen._4_4_ = mbedtls_cipher_crypt
                               ((mbedtls_cipher_context_t *)(*(long *)(i + 0x68) + 0x100),
                                (uchar *)(*(long *)(i + 0x68) + 0x40),
                                *(size_t *)(*(long *)(i + 0x68) + 0x18),*(uchar **)(i + 200),
                                *(size_t *)(i + 0xe0),*(uchar **)(i + 200),&stack0xffffffffffffffa8)
        ;
        if (olen._4_4_ != 0) {
          mbedtls_debug_print_ret
                    ((mbedtls_ssl_context *)i,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0x641,"mbedtls_cipher_crypt",olen._4_4_);
          return olen._4_4_;
        }
        if (*(size_t *)(i + 0xe0) != sStack_58) {
          mbedtls_debug_print_msg
                    ((mbedtls_ssl_context *)i,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0x647,"should never happen");
          return -0x6c00;
        }
        olen._4_4_ = 0;
      }
      else if ((padlen._4_4_ == MBEDTLS_MODE_GCM) || (padlen._4_4_ == MBEDTLS_MODE_CCM)) {
        explicit_iv_len._2_1_ = 0x10;
        if ((*(byte *)(**(long **)(i + 0x68) + 0x2c) & 2) != 0) {
          explicit_iv_len._2_1_ = 8;
        }
        lVar5 = *(long *)(*(long *)(i + 0x68) + 0x18) - *(long *)(*(long *)(i + 0x68) + 0x20);
        if (*(ulong *)(i + 0xe0) < lVar5 + (ulong)explicit_iv_len._2_1_) {
          mbedtls_debug_print_msg
                    ((mbedtls_ssl_context *)i,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0x65f,"msglen (%d) < explicit_iv_len (%d) + taglen (%d)",
                     *(undefined8 *)(i + 0xe0),lVar5,CONCAT44(uVar9,(uint)explicit_iv_len._2_1_));
          return -0x7180;
        }
        olen_1 = (*(long *)(i + 0xe0) - lVar5) - (ulong)explicit_iv_len._2_1_;
        puVar1 = *(uchar **)(i + 200);
        add_data._5_8_ = *(undefined8 *)(i + 200);
        *(size_t *)(i + 0xe0) = olen_1;
        unique0x00012000 = **(undefined8 **)(i + 0xa8);
        add_data[0] = (uchar)*(undefined4 *)(i + 0xd8);
        mbedtls_ssl_write_version
                  (*(int *)(i + 0x14),*(int *)(i + 0x18),*(uint *)(*(long *)i + 0x164) >> 1 & 1,
                   add_data + 1);
        add_data[3] = (uchar)((ulong)*(undefined8 *)(i + 0xe0) >> 8);
        add_data[4] = (uchar)*(undefined8 *)(i + 0xe0);
        mbedtls_debug_print_buf
                  ((mbedtls_ssl_context *)i,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0x670,"additional data used for AEAD",(uchar *)((long)&explicit_iv_len + 3),0xd)
        ;
        memcpy((void *)(*(long *)(i + 0x68) + 0x40 + *(long *)(*(long *)(i + 0x68) + 0x20)),
               *(void **)(i + 0xc0),
               *(long *)(*(long *)(i + 0x68) + 0x18) - *(long *)(*(long *)(i + 0x68) + 0x20));
        mbedtls_debug_print_buf
                  ((mbedtls_ssl_context *)i,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0x677,"IV used",(uchar *)(*(long *)(i + 0x68) + 0x40),
                   *(size_t *)(*(long *)(i + 0x68) + 0x18));
        mbedtls_debug_print_buf
                  ((mbedtls_ssl_context *)i,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0x678,"TAG used",puVar1 + olen_1,(ulong)explicit_iv_len._2_1_);
        dec_msglen._4_4_ =
             mbedtls_cipher_auth_decrypt
                       ((mbedtls_cipher_context_t *)(*(long *)(i + 0x68) + 0x100),
                        (uchar *)(*(long *)(i + 0x68) + 0x40),
                        *(size_t *)(*(long *)(i + 0x68) + 0x18),
                        (uchar *)((long)&explicit_iv_len + 3),0xd,puVar1,olen_1,
                        (uchar *)add_data._5_8_,(size_t *)&dec_msg,puVar1 + olen_1,
                        (ulong)explicit_iv_len._2_1_);
        if (dec_msglen._4_4_ != 0) {
          mbedtls_debug_print_ret
                    ((mbedtls_ssl_context *)i,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0x685,"mbedtls_cipher_auth_decrypt",dec_msglen._4_4_);
          if (dec_msglen._4_4_ == -0x6300) {
            return -0x7180;
          }
          return dec_msglen._4_4_;
        }
        padlen._0_4_ = (int)padlen + 1;
        if (dec_msg != (uchar *)olen_1) {
          mbedtls_debug_print_msg
                    ((mbedtls_ssl_context *)i,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0x690,"should never happen");
          return -0x6c00;
        }
        dec_msglen._4_4_ = 0;
      }
      else {
        if (padlen._4_4_ != MBEDTLS_MODE_CBC) {
          mbedtls_debug_print_msg
                    ((mbedtls_ssl_context *)i,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0x76d,"should never happen");
          return -0x6c00;
        }
        olen_2 = 0;
        computed_mac[0x28] = '\0';
        computed_mac[0x29] = '\0';
        computed_mac[0x2a] = '\0';
        computed_mac[0x2b] = '\0';
        computed_mac[0x2c] = '\0';
        computed_mac[0x2d] = '\0';
        computed_mac[0x2e] = '\0';
        computed_mac[0x2f] = '\0';
        if (1 < *(int *)(i + 0x18)) {
          olen_2 = *(size_t *)(*(long *)(i + 0x68) + 0x18);
        }
        if ((*(ulong *)(i + 0xe0) < olen_2 + *(long *)(*(long *)(i + 0x68) + 0x18)) ||
           (*(ulong *)(i + 0xe0) < olen_2 + *(long *)(*(long *)(i + 0x68) + 0x28) + 1)) {
          mbedtls_debug_print_msg
                    ((mbedtls_ssl_context *)i,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0x6b2,"msglen (%d) < max( ivlen(%d), maclen (%d) + 1 ) ( + expl IV )",
                     *(undefined8 *)(i + 0xe0),*(undefined8 *)(*(long *)(i + 0x68) + 0x18),
                     *(undefined8 *)(*(long *)(i + 0x68) + 0x28));
          return -0x7180;
        }
        minlen = *(size_t *)(i + 0xe0);
        puVar1 = *(uchar **)(i + 200);
        output = *(uchar **)(i + 200);
        if (*(int *)(*(long *)(i + 0x40) + 0x94) == 1) {
          mbedtls_debug_print_msg
                    ((mbedtls_ssl_context *)i,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0x6c3,"using encrypt then mac");
          minlen = minlen - *(long *)(*(long *)(i + 0x68) + 0x28);
          *(long *)(i + 0xe0) = *(long *)(i + 0xe0) - *(long *)(*(long *)(i + 0x68) + 0x28);
          unique0x00012000 = **(undefined8 **)(i + 0xa8);
          pseudo_hdr._0_2_ = *(undefined2 *)*(uchar **)(i + 0xb0);
          pseudo_hdr[2] = (*(uchar **)(i + 0xb0))[2];
          pseudo_hdr[3] = (uchar)((ulong)*(undefined8 *)(i + 0xe0) >> 8);
          pseudo_hdr[4] = (uchar)*(undefined8 *)(i + 0xe0);
          mbedtls_debug_print_buf
                    ((mbedtls_ssl_context *)i,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0x6cd,"MAC\'d meta-data",(uchar *)((long)&pad_count + 3),0xd);
          mbedtls_md_hmac_update
                    ((mbedtls_md_context_t *)(*(long *)(i + 0x68) + 0x90),
                     (uchar *)((long)&pad_count + 3),0xd);
          mbedtls_md_hmac_update
                    ((mbedtls_md_context_t *)(*(long *)(i + 0x68) + 0x90),*(uchar **)(i + 0xc0),
                     *(size_t *)(i + 0xe0));
          mbedtls_md_hmac_finish
                    ((mbedtls_md_context_t *)(*(long *)(i + 0x68) + 0x90),pseudo_hdr + 5);
          mbedtls_md_hmac_reset((mbedtls_md_context_t *)(*(long *)(i + 0x68) + 0x90));
          mbedtls_debug_print_buf
                    ((mbedtls_ssl_context *)i,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0x6d6,"message  mac",(uchar *)(*(long *)(i + 0xc0) + *(long *)(i + 0xe0)),
                     *(size_t *)(*(long *)(i + 0x68) + 0x28));
          mbedtls_debug_print_buf
                    ((mbedtls_ssl_context *)i,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0x6d8,"computed mac",pseudo_hdr + 5,*(size_t *)(*(long *)(i + 0x68) + 0x28));
          iVar4 = mbedtls_ssl_safer_memcmp
                            ((void *)(*(long *)(i + 0xc0) + *(long *)(i + 0xe0)),pseudo_hdr + 5,
                             *(size_t *)(*(long *)(i + 0x68) + 0x28));
          if (iVar4 != 0) {
            mbedtls_debug_print_msg
                      ((mbedtls_ssl_context *)i,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                       ,0x6dd,"message mac does not match");
            return -0x7180;
          }
          padlen._0_4_ = (int)padlen + 1;
        }
        if (*(ulong *)(i + 0xe0) % *(ulong *)(*(long *)(i + 0x68) + 0x18) != 0) {
          mbedtls_debug_print_msg
                    ((mbedtls_ssl_context *)i,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0x6eb,"msglen (%d) %% ivlen (%d) != 0",*(undefined8 *)(i + 0xe0),
                     *(undefined8 *)(*(long *)(i + 0x68) + 0x18));
          return -0x7180;
        }
        if (1 < *(int *)(i + 0x18)) {
          minlen = minlen - *(long *)(*(long *)(i + 0x68) + 0x18);
          *(long *)(i + 0xe0) = *(long *)(i + 0xe0) - *(long *)(*(long *)(i + 0x68) + 0x18);
          for (_auth_done = 0; _auth_done < *(ulong *)(*(long *)(i + 0x68) + 0x18);
              _auth_done = _auth_done + 1) {
            *(undefined1 *)(*(long *)(i + 0x68) + 0x40 + _auth_done) =
                 *(undefined1 *)(*(long *)(i + 0xc0) + _auth_done);
          }
        }
        iVar4 = mbedtls_cipher_crypt
                          ((mbedtls_cipher_context_t *)(*(long *)(i + 0x68) + 0x100),
                           (uchar *)(*(long *)(i + 0x68) + 0x40),
                           *(size_t *)(*(long *)(i + 0x68) + 0x18),puVar1,minlen,output,
                           (size_t *)(computed_mac + 0x28));
        if (iVar4 != 0) {
          mbedtls_debug_print_ret
                    ((mbedtls_ssl_context *)i,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0x703,"mbedtls_cipher_crypt",iVar4);
          return iVar4;
        }
        if (minlen != computed_mac._40_8_) {
          mbedtls_debug_print_msg
                    ((mbedtls_ssl_context *)i,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0x709,"should never happen");
          return -0x6c00;
        }
        if (*(int *)(i + 0x18) < 2) {
          memcpy((void *)(*(long *)(i + 0x68) + 0x40),(void *)(*(long *)(i + 0x68) + 0x138),
                 *(size_t *)(*(long *)(i + 0x68) + 0x18));
        }
        correct = (size_t)(int)(*(byte *)(*(long *)(i + 200) + *(long *)(i + 0xe0) + -1) + 1);
        if ((*(ulong *)(i + 0xe0) < *(long *)(*(long *)(i + 0x68) + 0x28) + correct) &&
           ((int)padlen == 0)) {
          correct = 0;
          uStack_48 = 0;
        }
        if (*(int *)(i + 0x18) == 0) {
          if (*(ulong *)(*(long *)(i + 0x68) + 0x18) < correct) {
            uStack_48 = 0;
          }
        }
        else {
          if (*(int *)(i + 0x18) < 1) {
            mbedtls_debug_print_msg
                      ((mbedtls_ssl_context *)i,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                       ,0x763,"should never happen");
            return -0x6c00;
          }
          real_count = 0;
          padding_idx = 1;
          uVar7 = (*(long *)(i + 0xe0) - correct) - 1;
          uStack_48 = (long)(int)(uint)(uVar7 < *(long *)(*(long *)(i + 0x68) + 0x28) + 0x4000U) &
                      (long)(int)(uint)(correct + 1 <= *(ulong *)(i + 0xe0)) & uStack_48;
          for (_auth_done = 1; _auth_done < 0x101; _auth_done = _auth_done + 1) {
            padding_idx = (long)(int)(uint)(_auth_done <= correct) & padding_idx;
            real_count = padding_idx *
                         (long)(int)(uint)((ulong)*(byte *)(*(long *)(i + 200) +
                                                           uStack_48 * uVar7 + _auth_done) ==
                                          correct - 1) + real_count;
          }
          uStack_48 = (long)(int)(uint)(real_count == correct) & uStack_48;
          correct = uStack_48 * 0x1ff & correct;
        }
        *(size_t *)(i + 0xe0) = *(long *)(i + 0xe0) - correct;
      }
      mbedtls_debug_print_buf
                ((mbedtls_ssl_context *)i,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0x772,"raw buffer after decryption",*(uchar **)(i + 200),*(size_t *)(i + 0xe0));
      if ((int)padlen == 0) {
        *(long *)(i + 0xe0) = *(long *)(i + 0xe0) - *(long *)(*(long *)(i + 0x68) + 0x28);
        **(undefined1 **)(i + 0xb8) = (char)((ulong)*(undefined8 *)(i + 0xe0) >> 8);
        *(char *)(*(long *)(i + 0xb8) + 1) = (char)*(undefined8 *)(i + 0xe0);
        memcpy(&j,(void *)(*(long *)(i + 200) + *(long *)(i + 0xe0)),
               *(size_t *)(*(long *)(i + 0x68) + 0x28));
        if (*(int *)(i + 0x18) == 0) {
          ssl_mac((mbedtls_md_context_t *)(*(long *)(i + 0x68) + 0x90),
                  (uchar *)(*(long *)(i + 0x68) + 100),*(uchar **)(i + 200),*(size_t *)(i + 0xe0),
                  *(uchar **)(i + 0xa8),*(int *)(i + 0xd8));
        }
        else {
          if (*(int *)(i + 0x18) < 1) {
            mbedtls_debug_print_msg
                      ((mbedtls_ssl_context *)i,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                       ,0x7b6,"should never happen");
            return -0x6c00;
          }
          lVar6 = *(long *)(i + 0xe0) + correct;
          lVar5 = *(long *)(i + 0xe0);
          uVar7 = uStack_48 * 0xff;
          mbedtls_md_hmac_update
                    ((mbedtls_md_context_t *)(*(long *)(i + 0x68) + 0x90),*(uchar **)(i + 0xa8),8);
          mbedtls_md_hmac_update
                    ((mbedtls_md_context_t *)(*(long *)(i + 0x68) + 0x90),*(uchar **)(i + 0xb0),3);
          mbedtls_md_hmac_update
                    ((mbedtls_md_context_t *)(*(long *)(i + 0x68) + 0x90),*(uchar **)(i + 0xb8),2);
          mbedtls_md_hmac_update
                    ((mbedtls_md_context_t *)(*(long *)(i + 0x68) + 0x90),*(uchar **)(i + 200),
                     *(size_t *)(i + 0xe0));
          mbedtls_md_hmac_finish
                    ((mbedtls_md_context_t *)(*(long *)(i + 0x68) + 0x90),
                     (uchar *)(*(long *)(i + 200) + *(long *)(i + 0xe0)));
          for (extra_run = 0; extra_run < (uVar7 & (lVar6 + 0x15U >> 6) - (lVar5 + 0x15U >> 6)) + 1;
              extra_run = extra_run + 1) {
            mbedtls_md_process((mbedtls_md_context_t *)(*(long *)(i + 0x68) + 0x90),
                               *(uchar **)(i + 200));
          }
          mbedtls_md_hmac_reset((mbedtls_md_context_t *)(*(long *)(i + 0x68) + 0x90));
        }
        mbedtls_debug_print_buf
                  ((mbedtls_ssl_context *)i,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0x7ba,"message  mac",(uchar *)&j,*(size_t *)(*(long *)(i + 0x68) + 0x28));
        mbedtls_debug_print_buf
                  ((mbedtls_ssl_context *)i,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0x7bc,"computed mac",(uchar *)(*(long *)(i + 200) + *(long *)(i + 0xe0)),
                   *(size_t *)(*(long *)(i + 0x68) + 0x28));
        iVar4 = mbedtls_ssl_safer_memcmp
                          (&j,(void *)(*(long *)(i + 200) + *(long *)(i + 0xe0)),
                           *(size_t *)(*(long *)(i + 0x68) + 0x28));
        if (iVar4 != 0) {
          uStack_48 = 0;
        }
        padlen._0_4_ = (int)padlen + 1;
        if (uStack_48 == 0) {
          return -0x7180;
        }
      }
      if ((int)padlen == 1) {
        if (*(long *)(i + 0xe0) == 0) {
          *(int *)(i + 0x118) = *(int *)(i + 0x118) + 1;
          if (3 < *(int *)(i + 0x118)) {
            mbedtls_debug_print_msg
                      ((mbedtls_ssl_context *)i,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                       ,0x7e2,"received four consecutive empty messages, possible DoS attack");
            return -0x7180;
          }
        }
        else {
          *(undefined4 *)(i + 0x118) = 0;
        }
        if ((*(uint *)(*(long *)i + 0x164) >> 1 & 1) != 1) {
          _auth_done = 8;
          while ((uVar7 = _auth_done, sVar8 = ssl_ep_len((mbedtls_ssl_context *)i),
                 sVar2 = _auth_done, sVar8 < uVar7 &&
                 (cVar3 = *(char *)(*(long *)(i + 0xa8) + (_auth_done - 1)) + '\x01',
                 *(char *)(*(long *)(i + 0xa8) + (_auth_done - 1)) = cVar3, cVar3 == '\0'))) {
            _auth_done = _auth_done - 1;
          }
          sVar8 = ssl_ep_len((mbedtls_ssl_context *)i);
          if (sVar2 == sVar8) {
            mbedtls_debug_print_msg
                      ((mbedtls_ssl_context *)i,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                       ,0x7f8,"incoming message counter would wrap");
            return -0x6b80;
          }
        }
        mbedtls_debug_print_msg
                  ((mbedtls_ssl_context *)i,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0x7fd,"<= decrypt buf");
        ssl_local._4_4_ = 0;
      }
      else {
        mbedtls_debug_print_msg
                  ((mbedtls_ssl_context *)i,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0x7d3,"should never happen");
        ssl_local._4_4_ = -0x6c00;
      }
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_decrypt_buf( mbedtls_ssl_context *ssl )
{
    size_t i;
    mbedtls_cipher_mode_t mode;
    int auth_done = 0;
#if defined(SSL_SOME_MODES_USE_MAC)
    size_t padlen = 0, correct = 1;
#endif

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> decrypt buf" ) );

    if( ssl->session_in == NULL || ssl->transform_in == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    mode = mbedtls_cipher_get_cipher_mode( &ssl->transform_in->cipher_ctx_dec );

    if( ssl->in_msglen < ssl->transform_in->minlen )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "in_msglen (%d) < minlen (%d)",
                       ssl->in_msglen, ssl->transform_in->minlen ) );
        return( MBEDTLS_ERR_SSL_INVALID_MAC );
    }

#if defined(MBEDTLS_ARC4_C) || defined(MBEDTLS_CIPHER_NULL_CIPHER)
    if( mode == MBEDTLS_MODE_STREAM )
    {
        int ret;
        size_t olen = 0;

        padlen = 0;

        if( ( ret = mbedtls_cipher_crypt( &ssl->transform_in->cipher_ctx_dec,
                                   ssl->transform_in->iv_dec,
                                   ssl->transform_in->ivlen,
                                   ssl->in_msg, ssl->in_msglen,
                                   ssl->in_msg, &olen ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_crypt", ret );
            return( ret );
        }

        if( ssl->in_msglen != olen )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }
    }
    else
#endif /* MBEDTLS_ARC4_C || MBEDTLS_CIPHER_NULL_CIPHER */
#if defined(MBEDTLS_GCM_C) || defined(MBEDTLS_CCM_C)
    if( mode == MBEDTLS_MODE_GCM ||
        mode == MBEDTLS_MODE_CCM )
    {
        int ret;
        size_t dec_msglen, olen;
        unsigned char *dec_msg;
        unsigned char *dec_msg_result;
        unsigned char add_data[13];
        unsigned char taglen = ssl->transform_in->ciphersuite_info->flags &
                               MBEDTLS_CIPHERSUITE_SHORT_TAG ? 8 : 16;
        size_t explicit_iv_len = ssl->transform_in->ivlen -
                                 ssl->transform_in->fixed_ivlen;

        if( ssl->in_msglen < explicit_iv_len + taglen )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "msglen (%d) < explicit_iv_len (%d) "
                                "+ taglen (%d)", ssl->in_msglen,
                                explicit_iv_len, taglen ) );
            return( MBEDTLS_ERR_SSL_INVALID_MAC );
        }
        dec_msglen = ssl->in_msglen - explicit_iv_len - taglen;

        dec_msg = ssl->in_msg;
        dec_msg_result = ssl->in_msg;
        ssl->in_msglen = dec_msglen;

        memcpy( add_data, ssl->in_ctr, 8 );
        add_data[8]  = ssl->in_msgtype;
        mbedtls_ssl_write_version( ssl->major_ver, ssl->minor_ver,
                           ssl->conf->transport, add_data + 9 );
        add_data[11] = ( ssl->in_msglen >> 8 ) & 0xFF;
        add_data[12] = ssl->in_msglen & 0xFF;

        MBEDTLS_SSL_DEBUG_BUF( 4, "additional data used for AEAD",
                       add_data, 13 );

        memcpy( ssl->transform_in->iv_dec + ssl->transform_in->fixed_ivlen,
                ssl->in_iv,
                ssl->transform_in->ivlen - ssl->transform_in->fixed_ivlen );

        MBEDTLS_SSL_DEBUG_BUF( 4, "IV used", ssl->transform_in->iv_dec,
                                     ssl->transform_in->ivlen );
        MBEDTLS_SSL_DEBUG_BUF( 4, "TAG used", dec_msg + dec_msglen, taglen );

        /*
         * Decrypt and authenticate
         */
        if( ( ret = mbedtls_cipher_auth_decrypt( &ssl->transform_in->cipher_ctx_dec,
                                         ssl->transform_in->iv_dec,
                                         ssl->transform_in->ivlen,
                                         add_data, 13,
                                         dec_msg, dec_msglen,
                                         dec_msg_result, &olen,
                                         dec_msg + dec_msglen, taglen ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_auth_decrypt", ret );

            if( ret == MBEDTLS_ERR_CIPHER_AUTH_FAILED )
                return( MBEDTLS_ERR_SSL_INVALID_MAC );

            return( ret );
        }
        auth_done++;

        if( olen != dec_msglen )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }
    }
    else
#endif /* MBEDTLS_GCM_C || MBEDTLS_CCM_C */
#if defined(MBEDTLS_CIPHER_MODE_CBC) &&                                    \
    ( defined(MBEDTLS_AES_C) || defined(MBEDTLS_CAMELLIA_C) )
    if( mode == MBEDTLS_MODE_CBC )
    {
        /*
         * Decrypt and check the padding
         */
        int ret;
        unsigned char *dec_msg;
        unsigned char *dec_msg_result;
        size_t dec_msglen;
        size_t minlen = 0;
        size_t olen = 0;

        /*
         * Check immediate ciphertext sanity
         */
#if defined(MBEDTLS_SSL_PROTO_TLS1_1) || defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( ssl->minor_ver >= MBEDTLS_SSL_MINOR_VERSION_2 )
            minlen += ssl->transform_in->ivlen;
#endif

        if( ssl->in_msglen < minlen + ssl->transform_in->ivlen ||
            ssl->in_msglen < minlen + ssl->transform_in->maclen + 1 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "msglen (%d) < max( ivlen(%d), maclen (%d) "
                                "+ 1 ) ( + expl IV )", ssl->in_msglen,
                                ssl->transform_in->ivlen,
                                ssl->transform_in->maclen ) );
            return( MBEDTLS_ERR_SSL_INVALID_MAC );
        }

        dec_msglen = ssl->in_msglen;
        dec_msg = ssl->in_msg;
        dec_msg_result = ssl->in_msg;

        /*
         * Authenticate before decrypt if enabled
         */
#if defined(MBEDTLS_SSL_ENCRYPT_THEN_MAC)
        if( ssl->session_in->encrypt_then_mac == MBEDTLS_SSL_ETM_ENABLED )
        {
            unsigned char computed_mac[SSL_MAX_MAC_SIZE];
            unsigned char pseudo_hdr[13];

            MBEDTLS_SSL_DEBUG_MSG( 3, ( "using encrypt then mac" ) );

            dec_msglen -= ssl->transform_in->maclen;
            ssl->in_msglen -= ssl->transform_in->maclen;

            memcpy( pseudo_hdr +  0, ssl->in_ctr, 8 );
            memcpy( pseudo_hdr +  8, ssl->in_hdr, 3 );
            pseudo_hdr[11] = (unsigned char)( ( ssl->in_msglen >> 8 ) & 0xFF );
            pseudo_hdr[12] = (unsigned char)( ( ssl->in_msglen      ) & 0xFF );

            MBEDTLS_SSL_DEBUG_BUF( 4, "MAC'd meta-data", pseudo_hdr, 13 );

            mbedtls_md_hmac_update( &ssl->transform_in->md_ctx_dec, pseudo_hdr, 13 );
            mbedtls_md_hmac_update( &ssl->transform_in->md_ctx_dec,
                             ssl->in_iv, ssl->in_msglen );
            mbedtls_md_hmac_finish( &ssl->transform_in->md_ctx_dec, computed_mac );
            mbedtls_md_hmac_reset( &ssl->transform_in->md_ctx_dec );

            MBEDTLS_SSL_DEBUG_BUF( 4, "message  mac", ssl->in_iv + ssl->in_msglen,
                                              ssl->transform_in->maclen );
            MBEDTLS_SSL_DEBUG_BUF( 4, "computed mac", computed_mac,
                                              ssl->transform_in->maclen );

            if( mbedtls_ssl_safer_memcmp( ssl->in_iv + ssl->in_msglen, computed_mac,
                              ssl->transform_in->maclen ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "message mac does not match" ) );

                return( MBEDTLS_ERR_SSL_INVALID_MAC );
            }
            auth_done++;
        }
#endif /* MBEDTLS_SSL_ENCRYPT_THEN_MAC */

        /*
         * Check length sanity
         */
        if( ssl->in_msglen % ssl->transform_in->ivlen != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "msglen (%d) %% ivlen (%d) != 0",
                           ssl->in_msglen, ssl->transform_in->ivlen ) );
            return( MBEDTLS_ERR_SSL_INVALID_MAC );
        }

#if defined(MBEDTLS_SSL_PROTO_TLS1_1) || defined(MBEDTLS_SSL_PROTO_TLS1_2)
        /*
         * Initialize for prepended IV for block cipher in TLS v1.1 and up
         */
        if( ssl->minor_ver >= MBEDTLS_SSL_MINOR_VERSION_2 )
        {
            dec_msglen -= ssl->transform_in->ivlen;
            ssl->in_msglen -= ssl->transform_in->ivlen;

            for( i = 0; i < ssl->transform_in->ivlen; i++ )
                ssl->transform_in->iv_dec[i] = ssl->in_iv[i];
        }
#endif /* MBEDTLS_SSL_PROTO_TLS1_1 || MBEDTLS_SSL_PROTO_TLS1_2 */

        if( ( ret = mbedtls_cipher_crypt( &ssl->transform_in->cipher_ctx_dec,
                                   ssl->transform_in->iv_dec,
                                   ssl->transform_in->ivlen,
                                   dec_msg, dec_msglen,
                                   dec_msg_result, &olen ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_crypt", ret );
            return( ret );
        }

        if( dec_msglen != olen )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1)
        if( ssl->minor_ver < MBEDTLS_SSL_MINOR_VERSION_2 )
        {
            /*
             * Save IV in SSL3 and TLS1
             */
            memcpy( ssl->transform_in->iv_dec,
                    ssl->transform_in->cipher_ctx_dec.iv,
                    ssl->transform_in->ivlen );
        }
#endif

        padlen = 1 + ssl->in_msg[ssl->in_msglen - 1];

        if( ssl->in_msglen < ssl->transform_in->maclen + padlen &&
            auth_done == 0 )
        {
#if defined(MBEDTLS_SSL_DEBUG_ALL)
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "msglen (%d) < maclen (%d) + padlen (%d)",
                        ssl->in_msglen, ssl->transform_in->maclen, padlen ) );
#endif
            padlen = 0;
            correct = 0;
        }

#if defined(MBEDTLS_SSL_PROTO_SSL3)
        if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
        {
            if( padlen > ssl->transform_in->ivlen )
            {
#if defined(MBEDTLS_SSL_DEBUG_ALL)
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad padding length: is %d, "
                                    "should be no more than %d",
                               padlen, ssl->transform_in->ivlen ) );
#endif
                correct = 0;
            }
        }
        else
#endif /* MBEDTLS_SSL_PROTO_SSL3 */
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( ssl->minor_ver > MBEDTLS_SSL_MINOR_VERSION_0 )
        {
            /*
             * TLSv1+: always check the padding up to the first failure
             * and fake check up to 256 bytes of padding
             */
            size_t pad_count = 0, real_count = 1;
            size_t padding_idx = ssl->in_msglen - padlen - 1;

            /*
             * Padding is guaranteed to be incorrect if:
             *   1. padlen >= ssl->in_msglen
             *
             *   2. padding_idx >= MBEDTLS_SSL_MAX_CONTENT_LEN +
             *                     ssl->transform_in->maclen
             *
             * In both cases we reset padding_idx to a safe value (0) to
             * prevent out-of-buffer reads.
             */
            correct &= ( ssl->in_msglen >= padlen + 1 );
            correct &= ( padding_idx < MBEDTLS_SSL_MAX_CONTENT_LEN +
                                       ssl->transform_in->maclen );

            padding_idx *= correct;

            for( i = 1; i <= 256; i++ )
            {
                real_count &= ( i <= padlen );
                pad_count += real_count *
                             ( ssl->in_msg[padding_idx + i] == padlen - 1 );
            }

            correct &= ( pad_count == padlen ); /* Only 1 on correct padding */

#if defined(MBEDTLS_SSL_DEBUG_ALL)
            if( padlen > 0 && correct == 0 )
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad padding byte detected" ) );
#endif
            padlen &= correct * 0x1FF;
        }
        else
#endif /* MBEDTLS_SSL_PROTO_TLS1 || MBEDTLS_SSL_PROTO_TLS1_1 || \
          MBEDTLS_SSL_PROTO_TLS1_2 */
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        ssl->in_msglen -= padlen;
    }
    else
#endif /* MBEDTLS_CIPHER_MODE_CBC &&
          ( MBEDTLS_AES_C || MBEDTLS_CAMELLIA_C ) */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    MBEDTLS_SSL_DEBUG_BUF( 4, "raw buffer after decryption",
                   ssl->in_msg, ssl->in_msglen );

    /*
     * Authenticate if not done yet.
     * Compute the MAC regardless of the padding result (RFC4346, CBCTIME).
     */
#if defined(SSL_SOME_MODES_USE_MAC)
    if( auth_done == 0 )
    {
        unsigned char tmp[SSL_MAX_MAC_SIZE];

        ssl->in_msglen -= ssl->transform_in->maclen;

        ssl->in_len[0] = (unsigned char)( ssl->in_msglen >> 8 );
        ssl->in_len[1] = (unsigned char)( ssl->in_msglen      );

        memcpy( tmp, ssl->in_msg + ssl->in_msglen, ssl->transform_in->maclen );

#if defined(MBEDTLS_SSL_PROTO_SSL3)
        if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
        {
            ssl_mac( &ssl->transform_in->md_ctx_dec,
                      ssl->transform_in->mac_dec,
                      ssl->in_msg, ssl->in_msglen,
                      ssl->in_ctr, ssl->in_msgtype );
        }
        else
#endif /* MBEDTLS_SSL_PROTO_SSL3 */
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
        defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( ssl->minor_ver > MBEDTLS_SSL_MINOR_VERSION_0 )
        {
            /*
             * Process MAC and always update for padlen afterwards to make
             * total time independent of padlen
             *
             * extra_run compensates MAC check for padlen
             *
             * Known timing attacks:
             *  - Lucky Thirteen (http://www.isg.rhul.ac.uk/tls/TLStiming.pdf)
             *
             * We use ( ( Lx + 8 ) / 64 ) to handle 'negative Lx' values
             * correctly. (We round down instead of up, so -56 is the correct
             * value for our calculations instead of -55)
             */
            size_t j, extra_run = 0;
            extra_run = ( 13 + ssl->in_msglen + padlen + 8 ) / 64 -
                        ( 13 + ssl->in_msglen          + 8 ) / 64;

            extra_run &= correct * 0xFF;

            mbedtls_md_hmac_update( &ssl->transform_in->md_ctx_dec, ssl->in_ctr, 8 );
            mbedtls_md_hmac_update( &ssl->transform_in->md_ctx_dec, ssl->in_hdr, 3 );
            mbedtls_md_hmac_update( &ssl->transform_in->md_ctx_dec, ssl->in_len, 2 );
            mbedtls_md_hmac_update( &ssl->transform_in->md_ctx_dec, ssl->in_msg,
                             ssl->in_msglen );
            mbedtls_md_hmac_finish( &ssl->transform_in->md_ctx_dec,
                             ssl->in_msg + ssl->in_msglen );
            /* Call mbedtls_md_process at least once due to cache attacks */
            for( j = 0; j < extra_run + 1; j++ )
                mbedtls_md_process( &ssl->transform_in->md_ctx_dec, ssl->in_msg );

            mbedtls_md_hmac_reset( &ssl->transform_in->md_ctx_dec );
        }
        else
#endif /* MBEDTLS_SSL_PROTO_TLS1 || MBEDTLS_SSL_PROTO_TLS1_1 || \
              MBEDTLS_SSL_PROTO_TLS1_2 */
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        MBEDTLS_SSL_DEBUG_BUF( 4, "message  mac", tmp, ssl->transform_in->maclen );
        MBEDTLS_SSL_DEBUG_BUF( 4, "computed mac", ssl->in_msg + ssl->in_msglen,
                       ssl->transform_in->maclen );

        if( mbedtls_ssl_safer_memcmp( tmp, ssl->in_msg + ssl->in_msglen,
                         ssl->transform_in->maclen ) != 0 )
        {
#if defined(MBEDTLS_SSL_DEBUG_ALL)
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "message mac does not match" ) );
#endif
            correct = 0;
        }
        auth_done++;

        /*
         * Finally check the correct flag
         */
        if( correct == 0 )
            return( MBEDTLS_ERR_SSL_INVALID_MAC );
    }
#endif /* SSL_SOME_MODES_USE_MAC */

    /* Make extra sure authentication was performed, exactly once */
    if( auth_done != 1 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    if( ssl->in_msglen == 0 )
    {
        ssl->nb_zero++;

        /*
         * Three or more empty messages may be a DoS attack
         * (excessive CPU consumption).
         */
        if( ssl->nb_zero > 3 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "received four consecutive empty "
                                "messages, possible DoS attack" ) );
            return( MBEDTLS_ERR_SSL_INVALID_MAC );
        }
    }
    else
        ssl->nb_zero = 0;

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        ; /* in_ctr read from peer, not maintained internally */
    }
    else
#endif
    {
        for( i = 8; i > ssl_ep_len( ssl ); i-- )
            if( ++ssl->in_ctr[i - 1] != 0 )
                break;

        /* The loop goes to its end iff the counter is wrapping */
        if( i == ssl_ep_len( ssl ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "incoming message counter would wrap" ) );
            return( MBEDTLS_ERR_SSL_COUNTER_WRAPPING );
        }
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= decrypt buf" ) );

    return( 0 );
}